

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationsInfo.cpp
# Opt level: O1

void __thiscall ezc3d::DataNS::RotationNS::Info::Info(Info *this,c3d *c3d)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  PROCESSOR_TYPE PVar3;
  Parameters *pPVar4;
  Group *this_00;
  Parameter *pPVar5;
  vector<int,_std::allocator<int>_> *pvVar6;
  vector<double,_std::allocator<double>_> *pvVar7;
  Header *this_01;
  runtime_error *this_02;
  float fVar8;
  double dVar9;
  string local_a8;
  string local_88;
  string local_68;
  double local_48;
  undefined8 uStack_40;
  
  this->_hasGroup = false;
  this->_dataStart = 0xffffffffffffffff;
  this->_used = 0;
  this->_ratio = 0;
  pPVar4 = ezc3d::c3d::parameters(c3d);
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ROTATION","");
  bVar2 = ParametersNS::Parameters::isGroup(pPVar4,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar2) {
    return;
  }
  this->_hasGroup = true;
  pPVar4 = ezc3d::c3d::parameters(c3d);
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"ROTATION","");
  this_00 = ParametersNS::Parameters::group(pPVar4,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"DATA_START","");
  bVar2 = ParametersNS::GroupNS::Group::isParameter(this_00,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"DATA_START","");
    pPVar5 = ParametersNS::GroupNS::Group::parameter(this_00,&local_a8);
    pvVar6 = ParametersNS::GroupNS::Parameter::valuesAsInt(pPVar5);
    this->_dataStart =
         (long)*(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"USED","");
    bVar2 = ParametersNS::GroupNS::Group::isParameter(this_00,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"USED","");
      pPVar5 = ParametersNS::GroupNS::Group::parameter(this_00,&local_a8);
      pvVar6 = ParametersNS::GroupNS::Parameter::valuesAsInt(pPVar5);
      this->_used = (long)*(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      local_a8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"RATIO","");
      bVar2 = ParametersNS::GroupNS::Group::isParameter(this_00,&local_a8);
      if (bVar2) {
        bVar2 = false;
      }
      else {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"RATE","");
        bVar2 = ParametersNS::GroupNS::Group::isParameter(this_00,&local_68);
        bVar2 = !bVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) {
        local_a8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"RATIO","");
        bVar2 = ParametersNS::GroupNS::Group::isParameter(this_00,&local_a8);
        if (bVar2) {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"RATIO","");
          pPVar5 = ParametersNS::GroupNS::Group::parameter(this_00,&local_88);
          pvVar6 = ParametersNS::GroupNS::Parameter::valuesAsInt(pPVar5);
          dVar9 = (double)*(pvVar6->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start;
        }
        else {
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"RATE","");
          pPVar5 = ParametersNS::GroupNS::Group::parameter(this_00,&local_88);
          pvVar7 = ParametersNS::GroupNS::Parameter::valuesAsDouble(pPVar5);
          local_48 = *(pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start;
          uStack_40 = 0;
          this_01 = ezc3d::c3d::header(c3d);
          fVar8 = Header::frameRate(this_01);
          dVar9 = local_48 / (double)fVar8;
        }
        this->_ratio = (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f | (long)dVar9;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        pPVar4 = ezc3d::c3d::parameters(c3d);
        PVar3 = ParametersNS::Parameters::processorType(pPVar4);
        this->_processorType = PVar3;
        return;
      }
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"RATIO or RATE must be present in ROTATION.");
    }
    else {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"USED is not present in ROTATION.");
    }
  }
  else {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_02,"DATA_START is not present in ROTATION.");
  }
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ezc3d::DataNS::RotationNS::Info::Info(const ezc3d::c3d &c3d)
    : _hasGroup(false), _dataStart(-1), _used(0), _ratio(0) {
  if (!c3d.parameters().isGroup("ROTATION")) {
    return;
  }
  _hasGroup = true;

  const ezc3d::ParametersNS::GroupNS::Group &group =
      c3d.parameters().group("ROTATION");

  // Do a sanity check before accessing
  if (!group.isParameter("DATA_START")) {
    throw std::runtime_error("DATA_START is not present in ROTATION.");
  }
  _dataStart = group.parameter("DATA_START").valuesAsInt()[0];

  if (!group.isParameter("USED")) {
    throw std::runtime_error("USED is not present in ROTATION.");
  }
  _used = group.parameter("USED").valuesAsInt()[0];

  if (!group.isParameter("RATIO") && !group.isParameter("RATE")) {
    throw std::runtime_error("RATIO or RATE must be present in ROTATION.");
  }
  _ratio = static_cast<size_t>(
      group.isParameter("RATIO") ? group.parameter("RATIO").valuesAsInt()[0]
                                 : group.parameter("RATE").valuesAsDouble()[0] /
                                       c3d.header().frameRate());

  _processorType = c3d.parameters().processorType();
}